

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O3

void __thiscall
RemovedMempoolTransactionInfo::RemovedMempoolTransactionInfo
          (RemovedMempoolTransactionInfo *this,CTxMemPoolEntry *entry)

{
  uint uVar1;
  long lVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int64_t iVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  peVar3 = (entry->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (entry->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  iVar4 = GetVirtualTransactionSize((long)entry->nTxWeight,entry->sigOpCost,nBytesPerSigOp);
  uVar1 = entry->entryHeight;
  (this->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar3;
  (this->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this_00;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->info).m_fee = entry->nFee;
    (this->info).m_virtual_transaction_size = (long)(int)iVar4;
    (this->info).txHeight = uVar1;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    (this->info).m_fee = entry->nFee;
    (this->info).m_virtual_transaction_size = (long)(int)iVar4;
    (this->info).txHeight = uVar1;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

explicit RemovedMempoolTransactionInfo(const CTxMemPoolEntry& entry)
        : info{entry.GetSharedTx(), entry.GetFee(), entry.GetTxSize(), entry.GetHeight()} {}